

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall Parsing::File::load(File *this)

{
  bool bVar1;
  string local_78;
  string local_58;
  string local_38;
  File *local_18;
  File *this_local;
  
  local_18 = this;
  std::__cxx11::string::string((string *)&local_38,(string *)&this->_path);
  parseExt(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_78,(string *)&this->_path);
  parseName(&local_58,this,&local_78);
  std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = isFile(this);
  return bVar1;
}

Assistant:

bool File::load() noexcept
    {
        parseExt(_path);
        _name = parseName(_path);
        if (!isFile())
            return false;
        return true;
    }